

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_00;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_01;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_02;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  init_03;
  format_string<int> fmt;
  format_string<int> fmt_00;
  format_string<double> fmt_01;
  format_string<const_char_(&)[4],_const_char_(&)[10]> fmt_02;
  format_string<const_char_(&)[6],_const_char_(&)[5]> fmt_03;
  format_string<int_&> fmt_04;
  int __how;
  int __fd;
  spdlog_ex *ex;
  int i;
  char (*in_stack_ffffffffffffe828) [8];
  seconds in_stack_ffffffffffffe830;
  anon_class_1_0_00000001 *in_stack_ffffffffffffe838;
  executor *in_stack_ffffffffffffe840;
  iterator in_stack_ffffffffffffe848;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *in_stack_ffffffffffffe850;
  size_t in_stack_ffffffffffffe858;
  unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
  *in_stack_ffffffffffffe888;
  unique_ptr<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
  *in_stack_ffffffffffffe890;
  unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
  *in_stack_ffffffffffffe898;
  unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
  *in_stack_ffffffffffffe8a0;
  value_t in_stack_ffffffffffffe8be;
  undefined1 in_stack_ffffffffffffe8bf;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffe8c0;
  initializer_list_t in_stack_ffffffffffffe8c8;
  json *in_stack_ffffffffffffe978;
  executor *in_stack_ffffffffffffe980;
  undefined1 **local_1670;
  undefined1 **local_1658;
  undefined1 **local_1640;
  undefined1 **local_1628;
  undefined1 **local_1610;
  undefined1 **local_15f8;
  undefined1 local_15c9;
  undefined1 local_15c8 [36];
  int local_15a4;
  duration<long,std::ratio<1l,1l>> local_15a0 [460];
  int local_13d4;
  undefined8 local_960;
  undefined4 local_794;
  undefined4 local_5cc;
  undefined1 local_407;
  undefined1 local_406;
  undefined1 local_405;
  undefined4 local_404;
  undefined8 *local_400;
  undefined1 *local_3f8 [4];
  undefined1 local_3d8 [32];
  undefined8 *local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a4;
  undefined8 *local_3a0;
  undefined1 *local_398 [4];
  undefined1 local_378 [32];
  undefined8 *local_358;
  undefined8 local_350;
  undefined4 local_344;
  undefined8 *local_340;
  undefined1 *local_338 [4];
  undefined1 local_318 [32];
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined8 *local_2e8;
  undefined1 *local_2e0 [4];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 *local_260;
  undefined1 *local_258 [4];
  undefined1 local_238 [32];
  undefined8 *local_218;
  undefined8 local_210;
  undefined8 *local_208;
  undefined1 *local_200 [4];
  undefined8 *local_1e0;
  undefined8 local_1d8;
  int local_4;
  
  local_4 = 0;
  load_levels_example();
  spdlog::info<char[19]>((char (*) [19])in_stack_ffffffffffffe838);
  local_407 = 1;
  local_208 = local_200;
  local_406 = 1;
  local_260 = local_258;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<const_char_(&)[8],_0>
            ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffe830.__r,in_stack_ffffffffffffe828);
  local_260 = (undefined8 *)local_238;
  local_405 = 1;
  local_2e8 = local_2e0;
  local_340 = local_338;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<const_char_(&)[6],_0>
            ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffe830.__r,(char (*) [6])in_stack_ffffffffffffe828);
  local_340 = (undefined8 *)local_318;
  local_344 = 1;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<int,_0>((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_ffffffffffffe830.__r,(int *)in_stack_ffffffffffffe828);
  local_2f8 = local_338;
  local_2f0 = 2;
  init._M_len = (size_type)in_stack_ffffffffffffe850;
  init._M_array = in_stack_ffffffffffffe848;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffe840,init);
  local_2e8 = (undefined8 *)local_2c0;
  local_3a0 = local_398;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<const_char_(&)[6],_0>
            ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffe830.__r,(char (*) [6])in_stack_ffffffffffffe828);
  local_3a0 = (undefined8 *)local_378;
  local_3a4 = 9;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<int,_0>((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_ffffffffffffe830.__r,(int *)in_stack_ffffffffffffe828);
  local_358 = local_398;
  local_350 = 2;
  init_00._M_len = (size_type)in_stack_ffffffffffffe850;
  init_00._M_array = in_stack_ffffffffffffe848;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffe840,init_00);
  local_2e8 = (undefined8 *)local_2a0;
  local_400 = local_3f8;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<const_char_(&)[6],_0>
            ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffe830.__r,(char (*) [6])in_stack_ffffffffffffe828);
  local_400 = (undefined8 *)local_3d8;
  local_404 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref<int,_0>((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_ffffffffffffe830.__r,(int *)in_stack_ffffffffffffe828);
  local_3b8 = local_3f8;
  local_3b0 = 2;
  init_01._M_len = (size_type)in_stack_ffffffffffffe850;
  init_01._M_array = in_stack_ffffffffffffe848;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffe840,init_01);
  local_405 = 0;
  local_280 = local_2e0;
  local_278 = 3;
  init_02._M_len = (size_type)in_stack_ffffffffffffe850;
  init_02._M_array = in_stack_ffffffffffffe848;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffe840,init_02);
  local_406 = 0;
  local_218 = local_258;
  local_210 = 2;
  init_03._M_len = (size_type)in_stack_ffffffffffffe850;
  init_03._M_array = in_stack_ffffffffffffe848;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_ffffffffffffe840,init_03);
  local_407 = 0;
  local_1e0 = local_200;
  local_1d8 = 1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8c8,(bool)in_stack_ffffffffffffe8bf,
               in_stack_ffffffffffffe8be);
  spdlog::details::executor::operator()(in_stack_ffffffffffffe980,in_stack_ffffffffffffe978);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)in_stack_ffffffffffffe830.__r);
  local_15f8 = (undefined1 **)&local_1e0;
  do {
    local_15f8 = local_15f8 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)0x10cf6e);
  } while (local_15f8 != local_200);
  local_1610 = (undefined1 **)&local_218;
  do {
    local_1610 = local_1610 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)0x10cfc0);
  } while (local_1610 != local_258);
  local_1628 = (undefined1 **)&local_280;
  do {
    local_1628 = local_1628 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)0x10d012);
  } while (local_1628 != local_2e0);
  local_1640 = (undefined1 **)&local_3b8;
  do {
    local_1640 = local_1640 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)0x10d064);
  } while (local_1640 != local_3f8);
  local_1658 = (undefined1 **)&local_358;
  do {
    local_1658 = local_1658 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)0x10d0b6);
  } while (local_1658 != local_398);
  local_1670 = (undefined1 **)&local_2f8;
  do {
    local_1670 = local_1670 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)0x10d108);
  } while (local_1670 != local_338);
  spdlog::details::executor::~executor(in_stack_ffffffffffffe840);
  ::fmt::v8::basic_format_string<char,_int>::basic_format_string<char[36],_0>
            ((basic_format_string<char,_int> *)in_stack_ffffffffffffe838,
             (char (*) [36])in_stack_ffffffffffffe830.__r);
  local_5cc = 0xc;
  fmt.str_.size_ = in_stack_ffffffffffffe858;
  fmt.str_.data_ = (char *)in_stack_ffffffffffffe850;
  spdlog::warn<int>(fmt,(int *)in_stack_ffffffffffffe848);
  spdlog::details::executor::~executor(in_stack_ffffffffffffe840);
  ::fmt::v8::basic_format_string<char,_int>::basic_format_string<char[61],_0>
            ((basic_format_string<char,_int> *)in_stack_ffffffffffffe838,
             (char (*) [61])in_stack_ffffffffffffe830.__r);
  local_794 = 0x2a;
  fmt_00.str_.size_ = in_stack_ffffffffffffe858;
  fmt_00.str_.data_ = (char *)in_stack_ffffffffffffe850;
  spdlog::critical<int>(fmt_00,(int *)in_stack_ffffffffffffe848);
  spdlog::details::executor::~executor(in_stack_ffffffffffffe840);
  ::fmt::v8::basic_format_string<char,_double>::basic_format_string<char[28],_0>
            ((basic_format_string<char,_double> *)in_stack_ffffffffffffe838,
             (char (*) [28])in_stack_ffffffffffffe830.__r);
  local_960 = 0x3ff3c0c1fc8f3238;
  fmt_01.str_.size_ = in_stack_ffffffffffffe858;
  fmt_01.str_.data_ = (char *)in_stack_ffffffffffffe850;
  spdlog::info<double>(fmt_01,(double *)in_stack_ffffffffffffe848);
  spdlog::details::executor::~executor(in_stack_ffffffffffffe840);
  ::fmt::v8::basic_format_string<char,_const_char_(&)[4],_const_char_(&)[10]>::
  basic_format_string<char[30],_0>
            ((basic_format_string<char,_const_char_(&)[4],_const_char_(&)[10]> *)
             in_stack_ffffffffffffe838,(char (*) [30])in_stack_ffffffffffffe830.__r);
  fmt_02.str_.size_ = in_stack_ffffffffffffe858;
  fmt_02.str_.data_ = (char *)in_stack_ffffffffffffe850;
  spdlog::info<char_const(&)[4],char_const(&)[10]>
            (fmt_02,(char (*) [4])in_stack_ffffffffffffe848,(char (*) [10])in_stack_ffffffffffffe840
            );
  spdlog::details::executor::~executor(in_stack_ffffffffffffe840);
  ::fmt::v8::basic_format_string<char,_const_char_(&)[6],_const_char_(&)[5]>::
  basic_format_string<char[29],_0>
            ((basic_format_string<char,_const_char_(&)[6],_const_char_(&)[5]> *)
             in_stack_ffffffffffffe838,(char (*) [29])in_stack_ffffffffffffe830.__r);
  fmt_03.str_.size_ = in_stack_ffffffffffffe858;
  fmt_03.str_.data_ = (char *)in_stack_ffffffffffffe850;
  spdlog::info<char_const(&)[6],char_const(&)[5]>
            (fmt_03,(char (*) [6])in_stack_ffffffffffffe848,(char (*) [5])in_stack_ffffffffffffe840)
  ;
  spdlog::details::executor::~executor(in_stack_ffffffffffffe840);
  spdlog::set_level(trace);
  spdlog::debug<char[38]>((char (*) [38])in_stack_ffffffffffffe838);
  spdlog::details::executor::~executor(in_stack_ffffffffffffe840);
  spdlog::set_level(trace);
  spdlog::debug<char[35]>((char (*) [35])in_stack_ffffffffffffe838);
  spdlog::details::executor::~executor(in_stack_ffffffffffffe840);
  spdlog::details::make_unique<spdlog::populators::date_time_populator>();
  spdlog::details::make_unique<spdlog::populators::level_populator>();
  spdlog::details::make_unique<spdlog::populators::thread_id_populator>();
  spdlog::details::make_unique<spdlog::populators::message_populator>();
  spdlog::
  set_populators<std::unique_ptr<spdlog::populators::date_time_populator,std::default_delete<spdlog::populators::date_time_populator>>,std::unique_ptr<spdlog::populators::level_populator,std::default_delete<spdlog::populators::level_populator>>,std::unique_ptr<spdlog::populators::thread_id_populator,std::default_delete<spdlog::populators::thread_id_populator>>,std::unique_ptr<spdlog::populators::message_populator,std::default_delete<spdlog::populators::message_populator>>>
            (in_stack_ffffffffffffe8a0,in_stack_ffffffffffffe898,in_stack_ffffffffffffe890,
             in_stack_ffffffffffffe888);
  std::
  unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
  ::~unique_ptr((unique_ptr<spdlog::populators::message_populator,_std::default_delete<spdlog::populators::message_populator>_>
                 *)in_stack_ffffffffffffe830.__r);
  std::
  unique_ptr<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
  ::~unique_ptr((unique_ptr<spdlog::populators::thread_id_populator,_std::default_delete<spdlog::populators::thread_id_populator>_>
                 *)in_stack_ffffffffffffe830.__r);
  std::
  unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
  ::~unique_ptr((unique_ptr<spdlog::populators::level_populator,_std::default_delete<spdlog::populators::level_populator>_>
                 *)in_stack_ffffffffffffe830.__r);
  std::
  unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
  ::~unique_ptr((unique_ptr<spdlog::populators::date_time_populator,_std::default_delete<spdlog::populators::date_time_populator>_>
                 *)in_stack_ffffffffffffe830.__r);
  spdlog::info<char[47]>((char (*) [47])in_stack_ffffffffffffe838);
  spdlog::details::executor::~executor(in_stack_ffffffffffffe840);
  spdlog::set_populators<>();
  spdlog::info<char[37]>((char (*) [37])in_stack_ffffffffffffe838);
  spdlog::details::executor::~executor(in_stack_ffffffffffffe840);
  spdlog::details::make_unique<spdlog::json_formatter>();
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<spdlog::json_formatter,std::default_delete<spdlog::json_formatter>,void>
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             in_stack_ffffffffffffe840,
             (unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_> *)
             in_stack_ffffffffffffe838);
  spdlog::set_formatter(in_stack_ffffffffffffe850);
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            ((unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             in_stack_ffffffffffffe840);
  std::unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_>::~unique_ptr
            ((unique_ptr<spdlog::json_formatter,_std::default_delete<spdlog::json_formatter>_> *)
             in_stack_ffffffffffffe830.__r);
  spdlog::set_level(trace);
  spdlog::enable_backtrace(0x10d4aa);
  for (local_13d4 = 0; local_13d4 < 100; local_13d4 = local_13d4 + 1) {
    ::fmt::v8::basic_format_string<char,_int_&>::basic_format_string<char[21],_0>
              ((basic_format_string<char,_int_&> *)in_stack_ffffffffffffe838,
               (char (*) [21])in_stack_ffffffffffffe830.__r);
    fmt_04.str_.size_ = in_stack_ffffffffffffe858;
    fmt_04.str_.data_ = (char *)in_stack_ffffffffffffe850;
    spdlog::debug<int&>(fmt_04,(int *)in_stack_ffffffffffffe848);
    spdlog::details::executor::~executor(in_stack_ffffffffffffe840);
  }
  spdlog::dump_backtrace();
  stdout_logger_example();
  basic_example();
  rotating_example();
  daily_example();
  async_example();
  binary_example();
  multi_sink_example();
  user_defined_example();
  err_handler_example();
  trace_example();
  stopwatch_example();
  udp_example();
  custom_flags_example();
  local_15a4 = 3;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_15a0,&local_15a4);
  spdlog::flush_every(in_stack_ffffffffffffe830);
  __how = (int)&local_15c9;
  std::function<void(std::shared_ptr<spdlog::logger>)>::function<main::__0,void>
            ((function<void_(std::shared_ptr<spdlog::logger>)> *)in_stack_ffffffffffffe840,
             in_stack_ffffffffffffe838);
  spdlog::apply_all((function<void_(std::shared_ptr<spdlog::logger>)> *)0x10db72);
  __fd = (int)local_15c8;
  std::function<void_(std::shared_ptr<spdlog::logger>)>::~function
            ((function<void_(std::shared_ptr<spdlog::logger>)> *)0x10db81);
  spdlog::shutdown(__fd,__how);
  return local_4;
}

Assistant:

int main(int, char *[])
{
    // Log levels can be loaded from argv/env using "SPDLOG_LEVEL"
    load_levels_example();

#ifdef SPDLOG_JSON_LOGGER
    spdlog::info("Welcome to spdlog!")(
        {{"version", {{"major", SPDLOG_VER_MAJOR}, {"minor", SPDLOG_VER_MINOR}, {"patch", SPDLOG_VER_PATCH}}}});
#else
    spdlog::info("Welcome to spdlog version {}.{}.{}  !", SPDLOG_VER_MAJOR, SPDLOG_VER_MINOR, SPDLOG_VER_PATCH);
#endif

    spdlog::warn("Easy padding in numbers like {:08d}", 12);
    spdlog::critical("Support for int: {0:d};  hex: {0:x};  oct: {0:o}; bin: {0:b}", 42);
    spdlog::info("Support for floats {:03.2f}", 1.23456);
    spdlog::info("Positional args are {1} {0}..", "too", "supported");
    spdlog::info("{:>8} aligned, {:<8} aligned", "right", "left");

    // Runtime log levels
    spdlog::set_level(spdlog::level::info); // Set global log level to info
    spdlog::debug("This message should not be displayed!");
    spdlog::set_level(spdlog::level::trace); // Set specific logger's log level
    spdlog::debug("This message should be displayed..");

    // Customize msg format for all loggers
#ifdef SPDLOG_JSON_LOGGER
    spdlog::set_populators(
        spdlog::details::make_unique<spdlog::populators::date_time_populator>(),
        spdlog::details::make_unique<spdlog::populators::level_populator>(),
        spdlog::details::make_unique<spdlog::populators::thread_id_populator>(),
        spdlog::details::make_unique<spdlog::populators::message_populator>());
    spdlog::info("This is an info message with custom populators");
    spdlog::set_populators();
    spdlog::info("This should log an empty json object");
#else
    spdlog::set_pattern("[%H:%M:%S %z] [%^%L%$] [thread %t] %v");
    spdlog::info("This an info message with custom format");
#endif
    spdlog::set_formatter(spdlog::details::make_unique<spdlog::default_formatter>()); // back to default format
    spdlog::set_level(spdlog::level::info);

    // Backtrace support
    // Loggers can store in a ring buffer all messages (including debug/trace) for later inspection.
    // When needed, call dump_backtrace() to see what happened:
    spdlog::enable_backtrace(10); // create ring buffer with capacity of 10  messages
    for (int i = 0; i < 100; i++)
    {
        spdlog::debug("Backtrace message {}", i); // not logged..
    }
    // e.g. if some error happened:
    spdlog::dump_backtrace(); // log them now!

    try
    {
        stdout_logger_example();
        basic_example();
        rotating_example();
        daily_example();
        async_example();
        binary_example();
        multi_sink_example();
        user_defined_example();
        err_handler_example();
        trace_example();
        stopwatch_example();
        udp_example();
        custom_flags_example();

        // Flush all *registered* loggers using a worker thread every 3 seconds.
        // note: registered loggers *must* be thread safe for this to work correctly!
        spdlog::flush_every(std::chrono::seconds(3));

        // Apply some function on all registered loggers
        spdlog::apply_all([&](std::shared_ptr<spdlog::logger> l) { l->info("End of example."); });

        // Release all spdlog resources, and drop all loggers in the registry.
        // This is optional (only mandatory if using windows + async log).
        spdlog::shutdown();
    }

    // Exceptions will only be thrown upon failed logger or sink construction (not during logging).
    catch (const spdlog::spdlog_ex &ex)
    {
        std::printf("Log initialization failed: %s\n", ex.what());
        return 1;
    }
}